

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_int32(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s2;
  char *str;
  bson_t *b;
  size_t len;
  
  uVar3 = bson_new();
  bVar1 = bson_append_int32(uVar3,"foo",0xffffffff,0x4d2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x154,"test_bson_as_json_int32","bson_append_int32 (b, \"foo\", -1, 1234)");
    abort();
  }
  __s2 = (char *)bson_as_json(uVar3,&b);
  if (b != (bson_t *)0x10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x156,"test_bson_as_json_int32","len == 16");
    abort();
  }
  iVar2 = strcmp("{ \"foo\" : 1234 }",__s2);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x157,"test_bson_as_json_int32","!strcmp (\"{ \\\"foo\\\" : 1234 }\", str)");
    abort();
  }
  bson_free(__s2);
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bson_as_json_int32 (void)
{
   size_t len;
   bson_t *b;
   char *str;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "foo", -1, 1234));
   str = bson_as_json (b, &len);
   BSON_ASSERT (len == 16);
   BSON_ASSERT (!strcmp ("{ \"foo\" : 1234 }", str));
   bson_free (str);
   bson_destroy (b);
}